

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void testing::internal::TuplePrefix<3ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<std::__cxx11::ostringstream&>,testing::Matcher<std::__cxx11::string_const&>,testing::Matcher<std::_Ios_Openmode>>,std::tuple<std::__cxx11::ostringstream&,std::__cxx11::string_const&,std::_Ios_Openmode>>
               (tuple<testing::Matcher<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<std::_Ios_Openmode>_>
                *matchers,
               tuple<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::_Ios_Openmode>
               *values,ostream *os)

{
  bool bVar1;
  __tuple_element_t<2UL,_tuple<Matcher<basic_ostringstream<char>_&>,_Matcher<const_std::string_&>,_Matcher<_Ios_Openmode>_>_>
  *p_Var2;
  ostream *poVar3;
  MatcherBase<std::_Ios_Openmode> *this;
  string local_208;
  undefined1 local_1d8 [8];
  StringMatchResultListener listener;
  Value *value;
  type matcher;
  ostream *os_local;
  tuple<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::_Ios_Openmode>
  *values_local;
  tuple<testing::Matcher<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<std::_Ios_Openmode>_>
  *matchers_local;
  
  matcher.super_MatcherBase<std::_Ios_Openmode>.buffer_ = (Buffer)os;
  TuplePrefix<2ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<std::__cxx11::ostringstream&>,testing::Matcher<std::__cxx11::string_const&>,testing::Matcher<std::_Ios_Openmode>>,std::tuple<std::__cxx11::ostringstream&,std::__cxx11::string_const&,std::_Ios_Openmode>>
            (matchers,values,os);
  p_Var2 = std::
           get<2ul,testing::Matcher<std::__cxx11::ostringstream&>,testing::Matcher<std::__cxx11::string_const&>,testing::Matcher<std::_Ios_Openmode>>
                     (matchers);
  Matcher<std::_Ios_Openmode>::Matcher((Matcher<std::_Ios_Openmode> *)&value,p_Var2);
  listener._400_8_ =
       std::get<2ul,std::__cxx11::ostringstream&,std::__cxx11::string_const&,std::_Ios_Openmode>
                 (values);
  StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_1d8);
  bVar1 = MatcherBase<std::_Ios_Openmode>::MatchAndExplain
                    ((MatcherBase<std::_Ios_Openmode> *)&value,(_Ios_Openmode *)listener._400_8_,
                     (MatchResultListener *)local_1d8);
  if (!bVar1) {
    poVar3 = std::operator<<((ostream *)matcher.super_MatcherBase<std::_Ios_Openmode>.buffer_.shared
                             ,"  Expected arg #");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    std::operator<<(poVar3,": ");
    this = &std::
            get<2ul,testing::Matcher<std::__cxx11::ostringstream&>,testing::Matcher<std::__cxx11::string_const&>,testing::Matcher<std::_Ios_Openmode>>
                      (matchers)->super_MatcherBase<std::_Ios_Openmode>;
    MatcherBase<std::_Ios_Openmode>::DescribeTo
              (this,(ostream *)matcher.super_MatcherBase<std::_Ios_Openmode>.buffer_.shared);
    std::operator<<((ostream *)matcher.super_MatcherBase<std::_Ios_Openmode>.buffer_.shared,
                    "\n           Actual: ");
    UniversalPrint<std::_Ios_Openmode>
              ((_Ios_Openmode *)listener._400_8_,
               (ostream *)matcher.super_MatcherBase<std::_Ios_Openmode>.buffer_.shared);
    StringMatchResultListener::str_abi_cxx11_(&local_208,(StringMatchResultListener *)local_1d8);
    PrintIfNotEmpty(&local_208,
                    (ostream *)matcher.super_MatcherBase<std::_Ios_Openmode>.buffer_.shared);
    std::__cxx11::string::~string((string *)&local_208);
    std::operator<<((ostream *)matcher.super_MatcherBase<std::_Ios_Openmode>.buffer_.shared,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_1d8);
  Matcher<std::_Ios_Openmode>::~Matcher((Matcher<std::_Ios_Openmode> *)&value);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename std::tuple_element<N - 1, MatcherTuple>::type matcher =
        std::get<N - 1>(matchers);
    typedef typename std::tuple_element<N - 1, ValueTuple>::type Value;
    const Value& value = std::get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      *os << "  Expected arg #" << N - 1 << ": ";
      std::get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }